

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  upb_MiniTableField *puVar1;
  upb_SubCounts local_24;
  size_t sStack_20;
  upb_SubCounts sub_counts;
  size_t len_local;
  char *data_local;
  upb_MtDecoder *d_local;
  
  sStack_20 = len;
  puVar1 = (upb_MiniTableField *)upb_Arena_Malloc(d->arena,len * 0xc);
  d->fields = puVar1;
  upb_MdDecoder_CheckOutOfMemory(&d->base,d->fields);
  memset(&local_24,0,4);
  d->table->field_count_dont_copy_me__upb_internal_use_only = 0;
  d->table->fields_dont_copy_me__upb_internal_use_only = d->fields;
  upb_MtDecoder_Parse(d,data,sStack_20,d->fields,0xc,
                      &d->table->field_count_dont_copy_me__upb_internal_use_only,&local_24);
  upb_Arena_ShrinkLast
            (d->arena,d->fields,sStack_20 * 0xc,
             (ulong)d->table->field_count_dont_copy_me__upb_internal_use_only * 0xc);
  d->table->fields_dont_copy_me__upb_internal_use_only = d->fields;
  upb_MtDecoder_AllocateSubs(d,local_24);
  return;
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}